

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O0

Uri * Uri::Uri::file(Uri *__return_storage_ptr__,string *path)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  reference pcVar5;
  allocator<char> local_161;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  string local_148 [32];
  char *local_128;
  undefined4 local_120;
  allocator<char> local_119;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  string local_108 [39];
  allocator<char> local_e1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  string local_c8 [32];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  itr;
  iterator end;
  string authority;
  string empty;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string scheme;
  string *path_local;
  
  scheme.field_2._8_8_ = path;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"file",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)(authority.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&end);
  uVar3 = std::__cxx11::string::length();
  if (((uVar3 < 2) ||
      (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)path), *pcVar4 != '/')) ||
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)path), *pcVar4 != '/')) {
    psVar1 = (string *)((long)&authority.field_2 + 8);
    Uri(__return_storage_ptr__,(string *)local_38,(string *)&end,path,psVar1,psVar1);
  }
  else {
    itr._M_current = (char *)std::__cxx11::string::end();
    local_a8._M_current = (char *)std::__cxx11::string::begin();
    local_a0 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_a8,2);
    while (bVar2 = __gnu_cxx::operator!=(&local_a0,&itr), bVar2) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_a0);
      if (*pcVar5 == '/') {
        local_d8._M_current = (char *)std::__cxx11::string::begin();
        local_d0 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_d8,2);
        local_e0._M_current = local_a0._M_current;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (local_c8,local_d0,local_e0,&local_e1);
        std::__cxx11::string::operator=((string *)&end,local_c8);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator(&local_e1);
        local_110._M_current = local_a0._M_current;
        local_118._M_current = (char *)std::__cxx11::string::end();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (local_108,local_110,local_118,&local_119);
        std::__cxx11::string::operator=((string *)path,local_108);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator(&local_119);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) != 0) {
          std::__cxx11::string::operator=((string *)path,"/");
        }
        psVar1 = (string *)((long)&authority.field_2 + 8);
        Uri(__return_storage_ptr__,(string *)local_38,(string *)&end,path,psVar1,psVar1);
        goto LAB_001f120f;
      }
      local_128 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++(&local_a0,0);
    }
    local_158._M_current = (char *)std::__cxx11::string::begin();
    local_150 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator+(&local_158,2);
    local_160._M_current = (char *)std::__cxx11::string::end();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (local_148,local_150,local_160,&local_161);
    std::__cxx11::string::operator=((string *)&end,local_148);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_161);
    std::__cxx11::string::operator=((string *)path,"/");
    psVar1 = (string *)((long)&authority.field_2 + 8);
    Uri(__return_storage_ptr__,(string *)local_38,(string *)&end,path,psVar1,psVar1);
  }
LAB_001f120f:
  local_120 = 1;
  std::__cxx11::string::~string((string *)&end);
  std::__cxx11::string::~string((string *)(authority.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Uri Uri::file (string path) {
    string scheme = "file";
    string empty {};
    string authority {};

    if (IS_WINDOWS) {
        forwardToBackslashes(path);
    }

    if (path.length() >= 2 && path[0] == '/' && path[1] == '/') {
        auto end = path.end();
        for (auto itr = path.begin() + 2; itr != end; itr++) {
            if (*itr == '/') {
                authority = string(path.begin() + 2, itr);
                path = string(itr, path.end());
                if (path.empty()) path = "/";

                return Uri { scheme, authority, path, empty, empty };
            }
        }

        authority = string(path.begin() + 2, path.end());
        path = "/";

        return Uri { scheme, authority, path, empty, empty };
    }

    return Uri { scheme, authority, path, empty, empty };
}